

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

void nng_socket_recv(nng_socket s,nng_aio *aio)

{
  nng_err result;
  nni_sock *local_20;
  nni_sock *sock;
  
  nni_aio_reset(aio);
  result = nni_sock_find(&local_20,s.id);
  if (result == NNG_OK) {
    nni_sock_recv(local_20,aio);
    nni_sock_rele(local_20);
  }
  else {
    nni_aio_finish_error(aio,result);
  }
  return;
}

Assistant:

void
nng_socket_recv(nng_socket s, nng_aio *aio)
{
	nni_sock *sock;
	int       rv;

	nni_aio_reset(aio);
	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_sock_recv(sock, aio);
	nni_sock_rele(sock);
}